

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

void Q_SetKer(QMatrix *Q,Vector *RightKer,Vector *LeftKer)

{
  ulong uVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  ulong uVar4;
  Real *pRVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  V_Lock(RightKer);
  V_Lock(LeftKer);
  LVar3 = LASResult();
  if (LVar3 != LASOK) goto LAB_0010f1e6;
  uVar1 = Q->Dim;
  LVar3 = LASDimErr;
  if ((uVar1 == RightKer->Dim) && ((Q->Symmetry != False || (uVar1 == LeftKer->Dim)))) {
    if (Q->RightKerCmp != (Real *)0x0) {
      free(Q->RightKerCmp);
      Q->RightKerCmp = (Real *)0x0;
    }
    if (Q->LeftKerCmp != (Real *)0x0) {
      free(Q->LeftKerCmp);
      Q->LeftKerCmp = (Real *)0x0;
    }
    Q->UnitLeftKer = False;
    pRVar2 = RightKer->Cmp;
    if (uVar1 == 0) {
      dVar9 = 0.0;
      Q->UnitRightKer = True;
    }
    else {
      dVar7 = 0.0;
      uVar4 = 1;
      do {
        dVar7 = dVar7 + pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
      auVar8._8_4_ = (int)(uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      Q->UnitRightKer = True;
      if (ABS(dVar7 / dVar9) < 2.2250738585072014e-307) {
        Q->UnitRightKer = False;
      }
      else {
        if (uVar1 == 0) goto LAB_0010f030;
        uVar4 = 1;
        bVar6 = false;
        do {
          while (ABS(pRVar2[uVar4] / (dVar7 / dVar9) + -1.0) < 2.220446049250313e-15) {
            uVar4 = uVar4 + 1;
            if (uVar1 < uVar4) {
              if (!bVar6) goto LAB_0010f030;
              goto LAB_0010ef5f;
            }
          }
          Q->UnitRightKer = False;
          uVar4 = uVar4 + 1;
          bVar6 = true;
        } while (uVar4 <= uVar1);
      }
LAB_0010ef5f:
      dVar7 = 0.0;
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          dVar7 = dVar7 + pRVar2[uVar4] * pRVar2[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      if (2.2250738585072014e-307 <= ABS(dVar7)) {
        pRVar5 = (Real *)malloc(uVar1 * 8 + 8);
        Q->RightKerCmp = pRVar5;
        if (pRVar5 == (Real *)0x0) {
          LASError(LASMemAllocErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
        }
        else if (uVar1 != 0) {
          uVar4 = 1;
          do {
            pRVar5[uVar4] = pRVar2[uVar4] / dVar7;
            uVar4 = uVar4 + 1;
          } while (uVar4 <= uVar1);
        }
      }
    }
LAB_0010f030:
    if (Q->Symmetry != False) goto LAB_0010f1e6;
    pRVar2 = LeftKer->Cmp;
    dVar7 = 0.0;
    if (uVar1 == 0) {
      Q->UnitLeftKer = True;
      if (2.2250738585072014e-307 <= ABS(0.0 / dVar9)) goto LAB_0010f1e6;
LAB_0010f11b:
      Q->UnitLeftKer = False;
    }
    else {
      uVar4 = 1;
      do {
        dVar7 = dVar7 + pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
      Q->UnitLeftKer = True;
      if (ABS(dVar7 / dVar9) < 2.2250738585072014e-307) goto LAB_0010f11b;
      if (uVar1 == 0) goto LAB_0010f1e6;
      uVar4 = 1;
      bVar6 = false;
      do {
        while (ABS(pRVar2[uVar4] / (dVar7 / dVar9) + -1.0) < 2.220446049250313e-15) {
          uVar4 = uVar4 + 1;
          if (uVar1 < uVar4) {
            if (!bVar6) goto LAB_0010f1e6;
            goto LAB_0010f126;
          }
        }
        Q->UnitLeftKer = False;
        uVar4 = uVar4 + 1;
        bVar6 = true;
      } while (uVar4 <= uVar1);
    }
LAB_0010f126:
    dVar9 = 0.0;
    if (uVar1 != 0) {
      uVar4 = 1;
      do {
        dVar9 = dVar9 + pRVar2[uVar4] * pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    if (ABS(dVar9) < 2.2250738585072014e-307) goto LAB_0010f1e6;
    pRVar5 = (Real *)malloc(uVar1 * 8 + 8);
    Q->LeftKerCmp = pRVar5;
    if (pRVar5 != (Real *)0x0) {
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          pRVar5[uVar4] = pRVar2[uVar4] / dVar9;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
      goto LAB_0010f1e6;
    }
    LVar3 = LASMemAllocErr;
  }
  LASError(LVar3,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
LAB_0010f1e6:
  V_Unlock(RightKer);
  V_Unlock(LeftKer);
  return;
}

Assistant:

void Q_SetKer(QMatrix *Q, Vector *RightKer, Vector *LeftKer)
/* defines the null space in the case of a singular matrix */
{
    double Sum, Mean, Cmp, Norm;
    size_t Dim, Ind;
    Real *KerCmp;

    V_Lock(RightKer);
    V_Lock(LeftKer);
    
    if (LASResult() == LASOK) {
	if (Q->Dim == RightKer->Dim && (Q->Symmetry || Q->Dim == LeftKer->Dim)) {
  	    Dim = Q->Dim;
	    
	    /* release array for old null space components when it exists */ 
	    if (Q->RightKerCmp != NULL) {
	        free(Q->RightKerCmp);
	        Q->RightKerCmp = NULL;
	    }
	    if (Q->LeftKerCmp != NULL) {
	        free(Q->LeftKerCmp);
	        Q->LeftKerCmp = NULL;
	    }
	    Q->UnitRightKer = False;
	    Q->UnitLeftKer = False;
	    
	    /* right null space */
            KerCmp = RightKer->Cmp;
	    /* test whether the matrix Q has a unit right null space */
	    Sum = 0.0;
	    for(Ind = 1; Ind <= Dim; Ind++)
	        Sum += KerCmp[Ind];
	    Mean = Sum / (double)Dim;
	    Q->UnitRightKer = True;
	    if (!IsZero(Mean)) {
	        for(Ind = 1; Ind <= Dim; Ind++)
                    if (!IsOne(KerCmp[Ind] / Mean))
		        Q->UnitRightKer = False;
            } else {
	        Q->UnitRightKer = False;
	    }
	    if (!Q->UnitRightKer) {
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++) {
	            Cmp = KerCmp[Ind];
	            Sum += Cmp * Cmp;
	        }
		Norm = sqrt(Sum);
		if (!IsZero(Norm)) {
                    Q->RightKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		    if (Q->RightKerCmp != NULL) {
		        for(Ind = 1; Ind <= Dim; Ind++)
	                    Q->RightKerCmp[Ind] = KerCmp[Ind] / Norm;
		    } else {
	                LASError(LASMemAllocErr, "Q_SetKer", Q->Name, RightKer->Name,
		            LeftKer->Name);
		    }
		}
	    }
	    
	    if (!Q->Symmetry) {
	        /* left null space */
                KerCmp = LeftKer->Cmp;
	        /* test whether the matrix Q has a unit left null space */
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++)
	            Sum += KerCmp[Ind];
	        Mean = Sum / (double)Dim;
	        Q->UnitLeftKer = True;
	        if (!IsZero(Mean)) {
	            for(Ind = 1; Ind <= Dim; Ind++)
                        if (!IsOne(KerCmp[Ind] / Mean))
		            Q->UnitLeftKer = False;
                } else {
	            Q->UnitLeftKer = False;
	        }
	        if (!Q->UnitLeftKer) {
	            Sum = 0.0;
	            for(Ind = 1; Ind <= Dim; Ind++) {
	                Cmp = KerCmp[Ind];
	                Sum += Cmp * Cmp;
	            }
		    Norm = sqrt(Sum);
		    if (!IsZero(Norm)) {
                        Q->LeftKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		        if (Q->LeftKerCmp != NULL) {
		            for(Ind = 1; Ind <= Dim; Ind++)
	                        Q->LeftKerCmp[Ind] = KerCmp[Ind] / Norm;
		        } else {
	                    LASError(LASMemAllocErr, "Q_SetKer", Q->Name,
				RightKer->Name, LeftKer->Name);
		        }
	    	    }
	        }
	    } else {
	    }
	} else {
	    LASError(LASDimErr, "Q_SetKer", Q->Name, RightKer->Name, LeftKer->Name);
	}
    }

    V_Unlock(RightKer);
    V_Unlock(LeftKer);
}